

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionPort::IfcDistributionPort(IfcDistributionPort *this)

{
  *(undefined ***)&this->field_0x148 = &PTR__Object_00816a50;
  *(undefined8 *)&this->field_0x150 = 0;
  *(char **)&this->field_0x158 = "IfcDistributionPort";
  IfcPort::IfcPort((IfcPort *)this,&PTR_construction_vtable_24__008caeb8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x8cadb0;
  *(undefined8 *)&this->field_0x148 = 0x8caea0;
  *(undefined8 *)&this->field_0x88 = 0x8cadd8;
  *(undefined8 *)&this->field_0x98 = 0x8cae00;
  *(undefined8 *)&this->field_0xd0 = 0x8cae28;
  *(undefined8 *)&this->field_0x100 = 0x8cae50;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x8cae78;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>).field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>).field_0x20 = 0;
  this->field_0x140 = 0;
  return;
}

Assistant:

IfcDistributionPort() : Object("IfcDistributionPort") {}